

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O0

Var __thiscall
Js::DataView::GetValueWithCheck<float,float*>
          (DataView *this,Var offset,BOOL isLittleEndian,char16 *funcName)

{
  bool bVar1;
  ArrayBufferBase *this_00;
  uchar **ppuVar2;
  ScriptContext *scriptContext_00;
  Var pvVar3;
  double value;
  float *typedBuffer;
  uint32 local_38;
  float item;
  uint32 byteOffset;
  uint32 length;
  ScriptContext *scriptContext;
  char16 *funcName_local;
  Var pvStack_18;
  BOOL isLittleEndian_local;
  Var offset_local;
  DataView *this_local;
  
  scriptContext = (ScriptContext *)funcName;
  funcName_local._4_4_ = isLittleEndian;
  pvStack_18 = offset;
  offset_local = this;
  _byteOffset = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  item = (float)ArrayObject::GetLength((ArrayObject *)this);
  if ((uint)item < 4) {
    JavascriptError::ThrowRangeError(_byteOffset,-0x7ff5ec1f,(PCWSTR)scriptContext);
  }
  local_38 = ArrayBuffer::ToIndex(pvStack_18,-0x7ff5ec1f,_byteOffset,(int)item - 4,false);
  this_00 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  bVar1 = ArrayBufferBase::IsDetached(this_00);
  if (!bVar1) {
    ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->buffer);
    if (funcName_local._4_4_ == 0) {
      SwapRoutine<float>(this,(float *)(*ppuVar2 + local_38),(float *)((long)&typedBuffer + 4));
    }
    else {
      typedBuffer._4_4_ = *(float *)(*ppuVar2 + local_38);
    }
    value = (double)typedBuffer._4_4_;
    scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pvVar3 = JavascriptNumber::ToVarWithCheck(value,scriptContext_00);
    return pvVar3;
  }
  JavascriptError::ThrowTypeError(_byteOffset,-0x7ff5ebe5,(PCWSTR)scriptContext);
}

Assistant:

Var GetValueWithCheck(Var offset, BOOL isLittleEndian, const char16* funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName *typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *static_cast<PointerAccessTypeName>(typedBuffer);
            }
            return JavascriptNumber::ToVarWithCheck(item, GetScriptContext());
        }